

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzreducedspace.cpp
# Opt level: O0

void __thiscall
TPZReducedSpace::ComputeShape(TPZReducedSpace *this,TPZVec<double> *qsi,TPZMaterialData *data)

{
  long in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  TPZMaterialDataT<double> *tmp;
  size_t in_stack_000003e8;
  char *in_stack_000003f0;
  long local_38;
  
  if (in_RDX == 0) {
    local_38 = 0;
  }
  else {
    local_38 = __dynamic_cast(in_RDX,&TPZMaterialData::typeinfo,&TPZMaterialDataT<double>::typeinfo,
                              0);
  }
  if (local_38 == 0) {
    std::operator<<((ostream *)&std::cerr,
                    "virtual void TPZReducedSpace::ComputeShape(TPZVec<REAL> &, TPZMaterialData &)")
    ;
    std::operator<<((ostream *)&std::cerr,"is not available to complex types yet.\nAborting...\n");
    pzinternal::DebugStopImpl(in_stack_000003f0,in_stack_000003e8);
  }
  (**(code **)(*in_RDI + 0x318))(in_RDI,in_RSI,local_38);
  return;
}

Assistant:

void TPZReducedSpace::ComputeShape(TPZVec<REAL> &qsi,TPZMaterialData &data){
    auto *tmp = dynamic_cast<TPZMaterialDataT<STATE>*>(&data);
    if(!tmp){
        PZError<<__PRETTY_FUNCTION__;
        PZError<< "is not available to complex types yet.\nAborting...\n";
        DebugStop();
    }
    ShapeX(qsi,*tmp);
}